

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Convolution3DLayerParams::MergePartialFromCodedStream
          (Convolution3DLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  int length;
  uint uVar6;
  int byte_limit;
  uint32 uVar7;
  WeightParams *this_00;
  unsigned_long uVar8;
  pair<int,_int> pVar9;
  char cVar10;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  
LAB_0020b565:
  pbVar3 = input->buffer_;
  uVar7 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar11 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar6 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar7 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
      goto LAB_0020bba2;
      uVar11 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar11 = uVar11 | 0x100000000;
  }
  else {
LAB_0020bba2:
    uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar11 = 0;
    if (uVar7 - 1 < 0x3fff) {
      uVar11 = 0x100000000;
    }
    uVar11 = uVar7 | uVar11;
  }
  uVar7 = (uint32)uVar11;
  if ((uVar11 & 0x100000000) == 0) goto switchD_0020b61b_caseD_17;
  uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
  cVar10 = (char)uVar11;
  if (uVar6 < 0x32) {
    if (uVar6 < 0x14) {
      if (uVar6 == 1) {
        if (cVar10 != '\b') goto switchD_0020b61b_caseD_17;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bd36;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bd36:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->outputchannels_ = (int32)uVar11;
      }
      else if (uVar6 == 2) {
        if (cVar10 != '\x10') goto switchD_0020b61b_caseD_17;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bdc0;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bdc0:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->inputchannels_ = (int32)uVar11;
      }
      else {
        if ((uVar6 != 10) || (cVar10 != 'P')) goto switchD_0020b61b_caseD_17;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bd72;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bd72:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->ngroups_ = (int32)uVar11;
      }
      goto LAB_0020b565;
    }
    if (0x27 < uVar6) {
      if (uVar6 == 0x28) {
        if (cVar10 != '@') goto switchD_0020b61b_caseD_17;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bd8c;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bd8c:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->dilationdepth_ = (int32)uVar11;
      }
      else if (uVar6 == 0x29) {
        if (cVar10 != 'H') goto switchD_0020b61b_caseD_17;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bd54;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bd54:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->dilationheight_ = (int32)uVar11;
      }
      else {
        if ((uVar6 != 0x2a) || (cVar10 != 'P')) goto switchD_0020b61b_caseD_17;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bda6;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bda6:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->dilationwidth_ = (int32)uVar11;
      }
      goto LAB_0020b565;
    }
    switch(uVar6) {
    case 0x14:
      if (cVar10 != -0x60) break;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar11 = (ulong)bVar2;
        uVar7 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_0020bcbe;
        input->buffer_ = pbVar3 + 1;
      }
      else {
        uVar7 = 0;
LAB_0020bcbe:
        uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        if ((long)uVar11 < 0) {
          return false;
        }
      }
      this->kerneldepth_ = (int32)uVar11;
      goto LAB_0020b565;
    case 0x15:
      if (cVar10 == -0x58) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bcdc;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bcdc:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->kernelheight_ = (int32)uVar11;
        goto LAB_0020b565;
      }
      break;
    case 0x16:
      if (cVar10 == -0x50) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bcfa;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bcfa:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->kernelwidth_ = (int32)uVar11;
        goto LAB_0020b565;
      }
      break;
    case 0x1f:
      if (cVar10 == -8) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bd18;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bd18:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->stridedepth_ = (int32)uVar11;
        goto LAB_0020b565;
      }
      break;
    case 0x20:
      if (cVar10 == '\0') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bdda;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bdda:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->strideheight_ = (int32)uVar11;
        goto LAB_0020b565;
      }
      break;
    case 0x21:
      if (cVar10 == '\b') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bca0;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bca0:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->stridewidth_ = (int32)uVar11;
        goto LAB_0020b565;
      }
    }
  }
  else {
    if (uVar6 < 0x46) {
      if (uVar6 == 0x32) {
        if (cVar10 != -0x70) goto switchD_0020b61b_caseD_17;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar4, -1 < (long)uVar8)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar12.first;
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->hasbias_ = uVar8 != 0;
      }
      else {
        if (uVar6 == 0x3c) {
          if (cVar10 == -0x1e) {
            this_00 = this->weights_;
            if (this_00 == (WeightParams *)0x0) {
              this_00 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(this_00);
              this->weights_ = this_00;
            }
            goto LAB_0020bac8;
          }
          goto switchD_0020b61b_caseD_17;
        }
        if ((uVar6 != 0x3d) || (cVar10 != -0x16)) goto switchD_0020b61b_caseD_17;
        this_00 = this->bias_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->bias_ = this_00;
        }
LAB_0020bac8:
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < byte_limit)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (byte_limit < 0) {
            return false;
          }
        }
        pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,byte_limit);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar5 = WeightParams::MergePartialFromCodedStream(this_00,input);
        if (!bVar5) {
          return false;
        }
        bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar9.first);
        if (!bVar5) {
          return false;
        }
      }
      goto LAB_0020b565;
    }
    switch(uVar6) {
    case 0x46:
      if (cVar10 == '0') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bc25;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bc25:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->paddingtype_ = (int)uVar11;
        goto LAB_0020b565;
      }
      break;
    case 0x50:
      break;
    case 0x51:
      if (cVar10 == -0x78) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bbe9;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bbe9:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->custompaddingback_ = (int32)uVar11;
        goto LAB_0020b565;
      }
      break;
    case 0x52:
      if (cVar10 == -0x70) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bc82;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bc82:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->custompaddingtop_ = (int32)uVar11;
        goto LAB_0020b565;
      }
      break;
    case 0x53:
      if (cVar10 == -0x68) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bc07;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bc07:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->custompaddingbottom_ = (int32)uVar11;
        goto LAB_0020b565;
      }
      break;
    case 0x54:
      if (cVar10 == -0x60) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bc43;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bc43:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->custompaddingleft_ = (int32)uVar11;
        goto LAB_0020b565;
      }
      break;
    case 0x55:
      if (cVar10 == -0x58) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0020bbc8;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_0020bbc8:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->custompaddingright_ = (int32)uVar11;
        goto LAB_0020b565;
      }
      break;
    case 0x56:
      if (cVar10 == -0x50) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar4, -1 < (long)uVar8)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar12.first;
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->isdeconvolution_ = uVar8 != 0;
        goto LAB_0020b565;
      }
      break;
    case 0x57:
      if (cVar10 == -0x48) {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (2,0x2ba,input,&this->outputshape_);
      }
      else {
        if ((uVar7 & 0xff) != 0xba) break;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->outputshape_);
      }
      goto LAB_0020b5e2;
    }
  }
switchD_0020b61b_caseD_17:
  if (uVar7 == 0) {
    return true;
  }
  if ((uVar7 & 7) == 4) {
    return true;
  }
  bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
LAB_0020b5e2:
  if (bVar5 == false) {
    return false;
  }
  goto LAB_0020b565;
}

Assistant:

bool Convolution3DLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Convolution3DLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 outputChannels = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &outputchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 inputChannels = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &inputchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 nGroups = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &ngroups_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelDepth = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kerneldepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelHeight = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(168u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kernelheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 kernelWidth = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(176u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &kernelwidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideDepth = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(248u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &stridedepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideHeight = 32;
      case 32: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(256u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &strideheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 strideWidth = 33;
      case 33: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(264u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &stridewidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 dilationDepth = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(320u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &dilationdepth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 dilationHeight = 41;
      case 41: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(328u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &dilationheight_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 dilationWidth = 42;
      case 42: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(336u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &dilationwidth_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBias = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams weights = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(482u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams bias = 61;
      case 61: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(490u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Convolution3DLayerParams.PaddingType paddingType = 70;
      case 70: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(560u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_paddingtype(static_cast< ::CoreML::Specification::Convolution3DLayerParams_PaddingType >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingFront = 80;
      case 80: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(640u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingfront_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingBack = 81;
      case 81: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(648u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingback_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingTop = 82;
      case 82: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(656u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingtop_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingBottom = 83;
      case 83: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(664u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingbottom_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingLeft = 84;
      case 84: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(672u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingleft_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int32 customPaddingRight = 85;
      case 85: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(680u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &custompaddingright_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isDeconvolution = 86;
      case 86: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(688u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isdeconvolution_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 outputShape = 87;
      case 87: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(698u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_outputshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(696u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 698u, input, this->mutable_outputshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Convolution3DLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Convolution3DLayerParams)
  return false;
#undef DO_
}